

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

cstr idx2::ToString<idx2::idx2_err_code>(error<idx2::idx2_err_code> *Err,bool Force)

{
  idx2_err_code iVar1;
  name_map *pnVar2;
  long lVar3;
  undefined7 in_register_00000031;
  long lVar4;
  long *in_FS_OFFSET;
  bool bVar5;
  
  if (((int)CONCAT71(in_register_00000031,Force) != 0) || (Err->StrGened == false)) {
    iVar1 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != Err->Code) {
      lVar3 = 0x28;
      do {
        if (lVar3 == 0x3b8) {
          iVar1 = __Invalid__;
          break;
        }
        iVar1 = *(idx2_err_code *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar3);
        lVar3 = lVar3 + 0x18;
      } while (iVar1 != Err->Code);
    }
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal == iVar1) {
      pnVar2 = &idx2_err_code_s::NameMap;
      bVar5 = false;
    }
    else {
      lVar3 = 0;
      do {
        lVar4 = lVar3;
        bVar5 = lVar4 == 0x390;
        if (bVar5) goto LAB_001096e5;
        lVar3 = lVar4 + 0x18;
      } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar4] != iVar1);
      pnVar2 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar4);
    }
    if (bVar5) {
LAB_001096e5:
      __assert_fail("It != End(EnumS.NameMap)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Applications/../Core/idx2Common.h"
                    ,0x38,"stref idx2::ToString(idx2_err_code)");
    }
    snprintf((char *)(*in_FS_OFFSET + -0xf80),0x400,"%.*s (file: %s, line %d): %s",
             (ulong)(uint)pnVar2->Arr[0].Name.Size,pnVar2->Arr[0].Name.field_0.Ptr,
             in_FS_OFFSET[-0x170],(ulong)*(uint *)(in_FS_OFFSET + -0x130),Err->Msg);
  }
  return (cstr)(*in_FS_OFFSET + -0xf80);
}

Assistant:

cstr
ToString(const error<t>& Err, bool Force)
{
  if (Force || !Err.StrGened)
  {
    auto ErrStr = ToString(Err.Code);
    snprintf(ScratchBuf,
             sizeof(ScratchBuf),
             "%.*s (file: %s, line %d): %s",
             ErrStr.Size,
             ErrStr.Ptr,
             Err.Files[0],
             Err.Lines[0],
             Err.Msg);
  }
  return ScratchBuf;
}